

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# targets.c
# Opt level: O1

void text_data_bss_gaps(LinkedSection **sections)

{
  LinkedSection *pLVar1;
  LinkedSection *pLVar2;
  unsigned_long uVar3;
  
  pLVar1 = *sections;
  if (pLVar1 != (LinkedSection *)0x0) {
    pLVar2 = sections[1];
    if ((pLVar2 == (LinkedSection *)0x0) && (pLVar2 = sections[2], pLVar2 == (LinkedSection *)0x0))
    {
      uVar3 = 0;
    }
    else {
      uVar3 = pLVar2->base;
    }
    if (uVar3 != 0) {
      pLVar1->gapsize = uVar3 - (pLVar1->base + pLVar1->size);
    }
  }
  pLVar1 = sections[1];
  if ((pLVar1 != (LinkedSection *)0x0) && (sections[2] != (LinkedSection *)0x0)) {
    pLVar1->gapsize = sections[2]->base - (pLVar1->base + pLVar1->filesize);
  }
  return;
}

Assistant:

void text_data_bss_gaps(struct LinkedSection **sections)
/* calculate gap size between text-data and data-bss */
{
  if (sections[0]) {
    unsigned long nextsecbase = sections[1] ? sections[1]->base :
                                (sections[2] ? sections[2]->base : 0);
    if (nextsecbase) {
      sections[0]->gapsize = nextsecbase -
                             (sections[0]->base + sections[0]->size);
    }
  }
  if (sections[1] && sections[2]) {
    sections[1]->gapsize = sections[2]->base -
                           (sections[1]->base + sections[1]->filesize);
  }
}